

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>,std::shared_mutex>,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__0,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__1>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1,
                   undefined8 param_2)

{
  bool bVar1;
  const_iterator this;
  const_iterator __str;
  size_type sVar2;
  reference pvVar3;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *ele;
  const_iterator __end0;
  const_iterator __begin0;
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *__range1;
  string *ret;
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  string *string;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
  local_40 [4];
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_8;
  
  local_19 = 0;
  string = (string *)&stack0xffffffffffffffe6;
  local_18 = param_2;
  local_8 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  local_40[1]._M_current =
       (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)
       local_18;
  this = gmlc::libguarded::
         shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
         ::begin(in_stack_ffffffffffffff38);
  local_40[0]._M_current =
       (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)this;
  __str = gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end(in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                             *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
    ::operator*(local_40);
    in_stack_ffffffffffffff47 =
         helics::
         generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)
         ::$_1::operator()((anon_class_1_0_00000001 *)
                           CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                            *)in_stack_ffffffffffffff38);
    if ((bool)in_stack_ffffffffffffff47) {
      helics::
      generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)
      ::$_0::operator()((anon_class_1_0_00000001 *)__str._M_current,
                        (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                         *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      helics::generateJsonQuotedString(string);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 this._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __str._M_current);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_current
                ,(char)((ulong)__str._M_current >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
    ::operator++(local_40);
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (param_1);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_current,
               (char)((ulong)__str._M_current >> 0x38));
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    *pvVar3 = ']';
  }
  return (string *)param_1;
}

Assistant:

std::string generateStringVector_if(const X& data, Proc generator, validator valid)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        if (valid(ele)) {
            ret.append(helics::generateJsonQuotedString(generator(ele)));
            ret.push_back(',');
        }
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}